

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppTest.cpp
# Opt level: O1

void __thiscall TApp_OneFlagRef_Test::~TApp_OneFlagRef_Test(TApp_OneFlagRef_Test *this)

{
  (this->super_TApp).super_Test._vptr_Test = (_func_int **)&PTR__TApp_001a09d8;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&(this->super_TApp).args);
  CLI::App::~App(&(this->super_TApp).app);
  testing::Test::~Test((Test *)this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(TApp, OneFlagRef) {
    int ref;
    app.add_flag("-c,--count", ref);
    args = {"--count"};
    run();
    EXPECT_EQ((size_t)1, app.count("-c"));
    EXPECT_EQ((size_t)1, app.count("--count"));
    EXPECT_EQ(1, ref);
}